

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O2

char * Gia_ManRexPreprocess(char *pStr)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  sVar2 = strlen(pStr);
  pcVar3 = (char *)calloc(sVar2 * 2 + 10,1);
  pcVar3[0] = '(';
  pcVar3[1] = '(';
  iVar4 = 2;
  do {
    bVar1 = *pStr;
    uVar5 = (ulong)bVar1;
    if (uVar5 < 0x2a) {
      if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x30000000000U >> (uVar5 & 0x3f) & 1) == 0) {
          if (uVar5 == 0) {
            (pcVar3 + iVar4)[0] = ')';
            (pcVar3 + iVar4)[1] = ')';
            pcVar3[(long)iVar4 + 2] = '\0';
            return pcVar3;
          }
        }
        else {
          pcVar3[iVar4] = bVar1;
          iVar4 = iVar4 + 1;
        }
        goto LAB_0061a67a;
      }
    }
    else {
LAB_0061a67a:
      lVar6 = (long)iVar4;
      iVar4 = iVar4 + 1;
      pcVar3[lVar6] = bVar1;
    }
    pStr = (char *)((byte *)pStr + 1);
  } while( true );
}

Assistant:

char * Gia_ManRexPreprocess( char * pStr )
{
    char * pCopy = ABC_CALLOC( char, strlen(pStr) * 2 + 10 );
    int i, k = 0;
    pCopy[k++] = '(';
    pCopy[k++] = '(';
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] == '(' )
            pCopy[k++] = '(';
        else if ( pStr[i] == ')' )
            pCopy[k++] = ')';
        if ( pStr[i] != ' ' && pStr[i] != '\t' && pStr[i] != '\n' && pStr[i] != '\r' )
            pCopy[k++] = pStr[i];
    }
    pCopy[k++] = ')';
    pCopy[k++] = ')';
    pCopy[k++] = '\0';
    return pCopy;
}